

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O2

ebml_element *
EBML_ElementCreateUsingContext
          (void *AnyNode,uint8_t *PossibleId,int8_t IdLength,ebml_parser_context *Context,
          int *LowLevel,bool_t IsGlobalContext,bool_t bAllowDummy)

{
  int iVar1;
  ebml_context *peVar2;
  ebml_semantic *peVar3;
  ebml_context *Context_00;
  ebml_parser_context *Context_01;
  bool_t bVar4;
  ebml_element *peVar5;
  int ForProfile;
  ebml_context **ppeVar6;
  ebml_parser_context GlobalContext;
  ebml_context ContextGlobals;
  
  if (((Context != (ebml_parser_context *)0x0) &&
      (peVar2 = Context->Context, peVar2 != (ebml_context *)0x0)) &&
     (peVar3 = peVar2->Semantic, peVar3 != (ebml_semantic *)0x0)) {
    ppeVar6 = &peVar3->eClass;
    while (Context_00 = *ppeVar6, Context_00 != (ebml_context *)0x0) {
      bVar4 = EBML_IdMatch(PossibleId,IdLength,Context_00->Id);
      ppeVar6 = ppeVar6 + 4;
      if (bVar4 != 0) {
        peVar5 = EBML_ElementCreate(AnyNode,Context_00,0,Context->Profile);
        return peVar5;
      }
    }
    ContextGlobals.Semantic = peVar2->GlobalContext;
    if (ContextGlobals.Semantic == (ebml_semantic *)0x0) {
      __assert_fail("Context->Context->GlobalContext != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0xff,
                    "ebml_element *EBML_ElementCreateUsingContext(void *, const uint8_t *, int8_t, const ebml_parser_context *, int *, bool_t, bool_t)"
                   );
    }
    if (ContextGlobals.Semantic != peVar3) {
      GlobalContext.Context = &ContextGlobals;
      GlobalContext.EndPosition = -1;
      GlobalContext.Profile = Context->Profile;
      *LowLevel = *LowLevel + -1;
      ForProfile = 1;
      GlobalContext.UpContext = Context;
      ContextGlobals.GlobalContext = ContextGlobals.Semantic;
      peVar5 = EBML_ElementCreateUsingContext
                         (AnyNode,PossibleId,IdLength,&GlobalContext,LowLevel,1,bAllowDummy);
      if (peVar5 != (ebml_element *)0x0) {
        return peVar5;
      }
      iVar1 = *LowLevel;
      *LowLevel = iVar1 + 1;
      Context_01 = Context->UpContext;
      if (Context_01 != (ebml_parser_context *)0x0) {
        *LowLevel = iVar1 + 2;
        peVar5 = EBML_ElementCreateUsingContext
                           (AnyNode,PossibleId,IdLength,Context_01,LowLevel,IsGlobalContext,
                            bAllowDummy);
        return peVar5;
      }
      if (IdLength == '\0') {
        return (ebml_element *)0x0;
      }
      if (IsGlobalContext != 0) {
        return (ebml_element *)0x0;
      }
      if (bAllowDummy == 0) {
        return (ebml_element *)0x0;
      }
      *LowLevel = 0;
      peVar5 = CreateElement(AnyNode,PossibleId,IdLength,Context->Context,
                             (ebml_master *)(ulong)(uint)Context->Profile,ForProfile);
      return peVar5;
    }
  }
  return (ebml_element *)0x0;
}

Assistant:

static ebml_element *EBML_ElementCreateUsingContext(void *AnyNode, const uint8_t *PossibleId, int8_t IdLength, const ebml_parser_context *Context,
                                                    int *LowLevel, bool_t IsGlobalContext, bool_t bAllowDummy)
{
//	unsigned int ContextIndex;
    ebml_element *Result = NULL;
    const ebml_semantic *Semantic;

    if (!Context || !Context->Context || !Context->Context->Semantic)
        return NULL;

    // elements at the current level
    for (Semantic=Context->Context->Semantic;Semantic->eClass;Semantic++)
    {
        if (EBML_IdMatch(PossibleId, IdLength, Semantic->eClass->Id)) // && (bAllowDummy || bAllowOutOfProfile || !(Context->Profile & Semantic->DisabledProfile)))
        {
            Result = EBML_ElementCreate(AnyNode,Semantic->eClass,0, Context->Profile);
            return Result;
        }
    }

    // global elements
    assert(Context->Context->GlobalContext != NULL); // global should always exist, at least the EBML ones
    if (Context->Context->GlobalContext == Context->Context->Semantic)
        return NULL;
    else
    {
        ebml_context ContextGlobals;
        ebml_parser_context GlobalContext;

        ContextGlobals.Semantic = Context->Context->GlobalContext;
        ContextGlobals.GlobalContext = Context->Context->GlobalContext;

        GlobalContext.Context = &ContextGlobals;
        GlobalContext.UpContext = Context;
        GlobalContext.EndPosition = INVALID_FILEPOS_T;
        GlobalContext.Profile = Context->Profile;
        (*LowLevel)--;
        // recursive is good, but be carefull...
        Result = EBML_ElementCreateUsingContext(AnyNode,PossibleId,IdLength,&GlobalContext,LowLevel,1,bAllowDummy);
        if (Result)
            return Result;
        (*LowLevel)++;
    }

#ifdef TODO
    // parent elements
    if (Context.MasterElt != NULL && aID == Context.MasterElt->GlobalId) {
        (*LowLevel)++; // already one level up (same as context)
        return &Context.MasterElt->Create();
    }
#endif

    // check wether it's not part of an upper context
    if (Context->UpContext != NULL) {
        (*LowLevel)++;
        return EBML_ElementCreateUsingContext(AnyNode, PossibleId, IdLength, Context->UpContext, LowLevel, IsGlobalContext, bAllowDummy);
    }

    // dummy fallback
    if (!IsGlobalContext && bAllowDummy && IdLength!=0) {
        (*LowLevel) = 0;
        Result = CreateElement(AnyNode,PossibleId,IdLength,Context->Context,NULL, Context->Profile);
    }

    return Result;
}